

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::InterfaceSchema::Method> * __thiscall
kj::_::NullableValue<capnp::InterfaceSchema::Method>::operator=
          (NullableValue<capnp::InterfaceSchema::Method> *this,
          NullableValue<capnp::InterfaceSchema::Method> *other)

{
  Method *params;
  NullableValue<capnp::InterfaceSchema::Method> *other_local;
  NullableValue<capnp::InterfaceSchema::Method> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::InterfaceSchema::Method>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::InterfaceSchema::Method>(&(other->field_1).value);
      ctor<capnp::InterfaceSchema::Method,capnp::InterfaceSchema::Method>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }